

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_0::BorderPixel::Render(BorderPixel *this,Screen *screen)

{
  __shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar1;
  Pixel *pPVar2;
  int local_20;
  int local_1c;
  int y;
  int x;
  Screen *screen_local;
  BorderPixel *this_local;
  
  this_00 = (__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
            operator[](&(this->super_Node).children_,0);
  peVar1 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(this_00);
  (*peVar1->_vptr_Node[4])(peVar1,screen);
  if (((this->super_Node).box_.x_min < (this->super_Node).box_.x_max) &&
     ((this->super_Node).box_.y_min < (this->super_Node).box_.y_max)) {
    pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,(this->super_Node).box_.y_min);
    Pixel::operator=(pPVar2,&this->pixel_);
    pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,(this->super_Node).box_.y_min);
    Pixel::operator=(pPVar2,&this->pixel_);
    pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,(this->super_Node).box_.y_max);
    Pixel::operator=(pPVar2,&this->pixel_);
    pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,(this->super_Node).box_.y_max);
    Pixel::operator=(pPVar2,&this->pixel_);
    local_1c = (this->super_Node).box_.x_min;
    while (local_1c = local_1c + 1, local_1c < (this->super_Node).box_.x_max) {
      pPVar2 = Screen::PixelAt(screen,local_1c,(this->super_Node).box_.y_min);
      Pixel::operator=(pPVar2,&this->pixel_);
      pPVar2 = Screen::PixelAt(screen,local_1c,(this->super_Node).box_.y_max);
      Pixel::operator=(pPVar2,&this->pixel_);
    }
    local_20 = (this->super_Node).box_.y_min;
    while (local_20 = local_20 + 1, local_20 < (this->super_Node).box_.y_max) {
      pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_min,local_20);
      Pixel::operator=(pPVar2,&this->pixel_);
      pPVar2 = Screen::PixelAt(screen,(this->super_Node).box_.x_max,local_20);
      Pixel::operator=(pPVar2,&this->pixel_);
    }
  }
  return;
}

Assistant:

void Render(Screen& screen) override {
    // Draw content.
    children_[0]->Render(screen);

    // Draw the border.
    if (box_.x_min >= box_.x_max || box_.y_min >= box_.y_max) {
      return;
    }

    screen.PixelAt(box_.x_min, box_.y_min) = pixel_;
    screen.PixelAt(box_.x_max, box_.y_min) = pixel_;
    screen.PixelAt(box_.x_min, box_.y_max) = pixel_;
    screen.PixelAt(box_.x_max, box_.y_max) = pixel_;

    for (int x = box_.x_min + 1; x < box_.x_max; ++x) {
      screen.PixelAt(x, box_.y_min) = pixel_;
      screen.PixelAt(x, box_.y_max) = pixel_;
    }
    for (int y = box_.y_min + 1; y < box_.y_max; ++y) {
      screen.PixelAt(box_.x_min, y) = pixel_;
      screen.PixelAt(box_.x_max, y) = pixel_;
    }
  }